

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O3

Type * __thiscall soul::Type::removeReference(Type *__return_storage_ptr__,Type *this)

{
  Structure *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  PrimitiveType PVar5;
  BoundedIntSize BVar6;
  
  if (this->isRef != false) {
    CVar2 = this->arrayElementCategory;
    bVar3 = this->isRef;
    bVar4 = this->isConstant;
    PVar5.type = (this->primitiveType).type;
    __return_storage_ptr__->category = this->category;
    __return_storage_ptr__->arrayElementCategory = CVar2;
    __return_storage_ptr__->isRef = bVar3;
    __return_storage_ptr__->isConstant = bVar4;
    __return_storage_ptr__->primitiveType = (PrimitiveType)PVar5.type;
    BVar6 = this->arrayElementBoundingSize;
    __return_storage_ptr__->boundingSize = this->boundingSize;
    __return_storage_ptr__->arrayElementBoundingSize = BVar6;
    pSVar1 = (this->structure).object;
    (__return_storage_ptr__->structure).object = pSVar1;
    if (pSVar1 != (Structure *)0x0) {
      (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
    }
    __return_storage_ptr__->isRef = false;
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("isReference()","removeReference",0x19e);
}

Assistant:

void checkAssertion (bool condition, const char* message, const char* location, int line)
{
    if (! condition)
        throwInternalCompilerError (message, location, line);
}